

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_cross_platform.cpp
# Opt level: O2

int main(void)

{
  wrapper<std::unique_ptr<i1,_std::default_delete<i1>_>,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_impl1_*>_>
  wVar1;
  long lVar2;
  i injector;
  
  wVar1 = boost::ext::di::v1_3_0::core::
          injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
          ::
          create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,true>,std::unique_ptr<i1,std::default_delete<i1>>,boost::ext::di::v1_3_0::no_name>
                    ((injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
                      *)&injector);
  if (wVar1.wrapper_.object != (impl1 *)0x0) {
    lVar2 = __dynamic_cast(wVar1.wrapper_.object,&i1::typeinfo,&impl1::typeinfo,0);
    if (lVar2 != 0) {
      (**(code **)(*(long *)wVar1.wrapper_.object + 8))(wVar1.wrapper_.object);
      return 0;
    }
  }
  __assert_fail("dynamic_cast<impl1*>(object.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/bind_cross_platform.cpp"
                ,0x21,"int main()");
}

Assistant:

int main() {
  auto injector = di::make_injector(
#if defined(__cpp_variable_templates)
      di::bind<i1>.to<impl1>()
#else
      di::bind<i1>().to<impl1>()  // no variable templates
#endif
          );

  auto object = injector.create<std::unique_ptr<i1>>();
  assert(dynamic_cast<impl1*>(object.get()));
}